

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  void *pvVar1;
  size_t size;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  MixingHashState MVar6;
  ulong uVar7;
  size_t sVar8;
  ctrl_t cVar9;
  ulong uVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,64ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x20,0x40);
    if (local_40 != 0) {
      if (bVar5) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          pvVar1 = (common->heap_or_soo_).heap.slot_array.p;
          __p = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(local_50._12_4_,local_50._8_4_);
          sVar8 = 0;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar8)) {
              size = (__p->first)._M_string_length;
              MVar6 = hash_internal::MixingHashState::combine_contiguous
                                ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                                 (uchar *)(__p->first)._M_dataplus._M_p,size);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = MVar6.state_ + size;
              uVar10 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar11 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar10);
              uVar7 = FVar11.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar7) {
                __assert_fail("i < c.capacity()",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x70c,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar9 = (ctrl_t)uVar10 & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar7] = cVar9;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar7 - 0xf & uVar2)] = cVar9;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(uVar7 * 0x40 + (long)pvVar1),__p);
              __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>::
              destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((new_allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                          *)common,__p);
            }
            sVar8 = sVar8 + 1;
            __p = __p + 1;
          } while (sVar8 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x40);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }